

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::iterate
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  int *piVar7;
  int *piVar8;
  TestError *this_00;
  NotSupportedError *this_01;
  ulong uVar9;
  uint uVar10;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  GLuint GVar15;
  char *msg;
  uint uVar16;
  pointer p_Var17;
  long lVar18;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar6;
  ulong uVar11;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x5e0))(0x8c89);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glEnable(GL_RASTERIZER_DISCARD) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x531);
  (**(code **)(lVar6 + 0x5e0))(0x8d69);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glEnable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x535);
  p_Var17 = (this->m_runs).
            super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var17 !=
      (this->m_runs).
      super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      (**(code **)(lVar6 + 0xfd8))
                ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,p_Var17->n_patch_vertices);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x53e);
      (**(code **)(lVar6 + 0x1680))(p_Var17->po_id);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glUseProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x542);
      GVar15 = 0;
      if (p_Var17->drawcall_is_indiced != false) {
        GVar15 = p_Var17->bo_indices_id;
      }
      (**(code **)(lVar6 + 0x40))(0x8893,GVar15);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not update GL_ELEMENT_ARRAY_BUFFER binding",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x546);
      (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_bo_id);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x54a);
      (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_bo_id);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBindBufferBase() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x54d);
      lVar18 = (long)(int)(p_Var17->n_result_vertices * 0x14);
      (**(code **)(lVar6 + 0x150))(0x8c8e,lVar18,0,0x88e4);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBufferData() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x554);
      iVar3 = p_Var17->drawcall_count_multiplier * p_Var17->n_patch_vertices +
              p_Var17->n_restart_indices;
      GVar5 = TessellationShaderUtils::getTFModeForPrimitiveMode(p_Var17->primitive_mode,false);
      (**(code **)(lVar6 + 0x30))(GVar5);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBeginTransformFeedback() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x55c);
      GVar15 = p_Var17->n_instances;
      GVar5 = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
      if (p_Var17->drawcall_is_indiced == true) {
        if (GVar15 == 1) {
          (**(code **)(lVar6 + 0x568))();
          dVar4 = (**(code **)(lVar6 + 0x800))();
          msg = "glDrawElements() failed";
          iVar3 = 0x56a;
        }
        else {
          (**(code **)(lVar6 + 0x580))(GVar5,iVar3,0x1401,0);
          dVar4 = (**(code **)(lVar6 + 0x800))();
          msg = "glDrawElementsInstanced() failed";
          iVar3 = 0x565;
        }
      }
      else if (GVar15 == 1) {
        (**(code **)(lVar6 + 0x538))();
        dVar4 = (**(code **)(lVar6 + 0x800))();
        msg = "glDrawArrays() failed";
        iVar3 = 0x579;
      }
      else {
        (**(code **)(lVar6 + 0x548))(GVar5,0,iVar3,GVar15);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        msg = "glDrawArraysInstanced() failed";
        iVar3 = 0x573;
      }
      glu::checkError(dVar4,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,iVar3);
      (**(code **)(lVar6 + 0x638))();
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glEndTransformFeedback() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x57e);
      piVar7 = (int *)(**(code **)(lVar6 + 0xd00))(0x8c8e,0,lVar18,1);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glMapBufferRange() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x584);
      uVar12 = p_Var17->n_result_vertices;
      uVar9 = (ulong)uVar12;
      if (uVar9 != 0) {
        iVar3 = p_Var17->n_patch_vertices + -1;
        uVar16 = 0;
        piVar8 = piVar7;
        do {
          iVar2 = *piVar8;
          if (iVar2 != iVar3) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Invalid gl_InvocationID value (",0x1f);
            std::ostream::operator<<(poVar1,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") was found for result coordinate at index ",0x2b);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," instead of expected value (",0x1c);
            std::ostream::operator<<(poVar1,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Invalid gl_InvocationID value used in TC stage",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                       ,0x5a0);
            goto LAB_00d413a7;
          }
          piVar8 = piVar8 + 5;
          uVar16 = uVar16 + 1;
        } while (uVar12 != uVar16);
        uVar16 = uVar12 / p_Var17->n_instances;
        uVar13 = 0;
        do {
          uVar14 = uVar13 & 0xffffffff;
          do {
            uVar11 = uVar14;
            uVar10 = (uint)uVar11;
            uVar14 = (ulong)(uVar10 - uVar16);
          } while (uVar16 <= uVar10);
          iVar3 = (int)(uVar11 / (((ulong)uVar12 / (ulong)p_Var17->drawcall_count_multiplier) /
                                 (ulong)p_Var17->n_instances));
          uVar14 = (ulong)(uint)((int)uVar13 * 5);
          if (piVar7[uVar14 + 2] != iVar3) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Invalid gl_PrimitiveID value (",0x1e);
            std::ostream::operator<<(poVar1,piVar7[uVar14 + 2]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") was used in TC stage instead of expected value (",0x32);
            std::ostream::operator<<(poVar1,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,")  as stored for result coordinate at index ",0x2c);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Invalid gl_PrimitiveID value used in TC stage",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                       ,0x5cb);
            goto LAB_00d413a7;
          }
          if (piVar7[uVar14 + 4] != iVar3) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Invalid gl_PrimitiveID value (",0x1e);
            std::ostream::operator<<(poVar1,piVar7[uVar14 + 4]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") was used in TE stage instead of expected value (",0x32);
            std::ostream::operator<<(poVar1,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,")  as stored for result coordinate at index ",0x2c);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Invalid gl_PrimitiveID value used in TE stage",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                       ,0x5db);
            goto LAB_00d413a7;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar9);
        if (uVar9 != 0) {
          uVar12 = 0;
          uVar13 = 0;
          do {
            iVar3 = p_Var17->n_patch_vertices;
            if (piVar7[(ulong)uVar12 + 1] != iVar3) {
              local_1b0._0_8_ =
                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"Invalid gl_PatchVerticesIn value (",0x22);
              std::ostream::operator<<(poVar1,piVar7[(ulong)uVar12 + 1]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,") was used in TC stage instead of expected value (",0x32
                        );
              std::ostream::operator<<(poVar1,iVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,")  as stored for result coordinate at index ",0x2c);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Invalid gl_PatchVerticesIn value used in TC stage",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                         ,0x5fa);
LAB_00d413a7:
              __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            if (piVar7[(ulong)uVar12 + 3] != iVar3) {
              local_1b0._0_8_ =
                   ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"Invalid gl_PatchVerticesIn value (",0x22);
              std::ostream::operator<<(poVar1,piVar7[(ulong)uVar12 + 3]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,") was used in TE stage instead of expected value (",0x32
                        );
              std::ostream::operator<<(poVar1,iVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,")  as stored for result coordinate at index ",0x2c);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              uVar9 = (ulong)p_Var17->n_result_vertices;
            }
            uVar13 = uVar13 + 1;
            uVar12 = uVar12 + 5;
          } while (uVar13 < uVar9);
        }
      }
      (**(code **)(lVar6 + 0x1670))(0x8c8e);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glUnmapBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x60e);
      p_Var17 = p_Var17 + 1;
    } while (p_Var17 !=
             (this->m_runs).
             super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* Initialize tessellation shader utilities */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* We don't need rasterization for this test */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed.");

	/* Enable GL_PRIMITIVE_RESTART_FIXED_INDEX mode for indiced draw calls. */
	gl.enable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed.");

	/* Iterate through all test runs configured */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* Configure run-specific amount of vertices per patch */
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, run.n_patch_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

		/* Activate run-specific program object */
		gl.useProgram(run.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

		/* Update GL_ELEMENT_ARRAY_BUFFER binding, depending on run properties */
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, (run.drawcall_is_indiced) ? run.bo_indices_id : 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not update GL_ELEMENT_ARRAY_BUFFER binding");

		/* Update transform feedback buffer bindings */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");

		/* Update the transform feedback buffer object storage. For each generated
		 * tessellated coordinate, TE stage will output 5 integers. */
		glw::GLint bo_size = static_cast<glw::GLint>(run.n_result_vertices * 5 /* ints */ * sizeof(int));

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Render the geometry */
		glw::GLint  drawcall_count = run.n_patch_vertices * run.drawcall_count_multiplier + run.n_restart_indices;
		glw::GLenum tf_mode =
			TessellationShaderUtils::getTFModeForPrimitiveMode(run.primitive_mode, false); /* is_point_mode_enabled */

		gl.beginTransformFeedback(tf_mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");
		{
			if (run.drawcall_is_indiced)
			{
				if (run.n_instances != 1)
				{
					gl.drawElementsInstanced(m_glExtTokens.PATCHES, drawcall_count, GL_UNSIGNED_BYTE,
											 DE_NULL, /* indices */
											 run.n_instances);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElementsInstanced() failed");
				} /* if (run.n_instances != 0) */
				else
				{
					gl.drawElements(m_glExtTokens.PATCHES, drawcall_count, GL_UNSIGNED_BYTE, DE_NULL); /* indices */
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElements() failed");
				}
			} /* if (run.drawcall_is_indiced) */
			else
			{
				if (run.n_instances != 1)
				{
					gl.drawArraysInstanced(m_glExtTokens.PATCHES, 0, /* first */
										   drawcall_count, run.n_instances);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArraysInstanced() failed");
				}
				else
				{
					gl.drawArrays(m_glExtTokens.PATCHES, 0, /* first */
								  drawcall_count);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
				}
			}
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Map the result buffer object */
		const int* result_data = (const int*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
															   bo_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

		/* Verify gl_InvocationID values used in both stages were correct. In TE:
		 *
		 * te_tc_invocation_id = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_invocation_id is the very first item, so no need to offset
		 * result_data when initializing result_traveller_ptr below.
		 */
		const unsigned int n_int_varyings_per_tess_coordinate = 5;
		const int*		   result_traveller_ptr				  = result_data;

		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices;
			 ++n_coordinate, result_traveller_ptr += n_int_varyings_per_tess_coordinate)
		{
			const int expected_invocation_id = run.n_patch_vertices - 1;
			const int invocation_id_value	= *result_traveller_ptr;

			if (invocation_id_value != expected_invocation_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_InvocationID value (" << invocation_id_value
								   << ") "
									  "was found for result coordinate at index "
								   << n_coordinate << " "
													  "instead of expected value ("
								   << expected_invocation_id << ")." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_InvocationID value used in TC stage");
			}
		} /* for (all result coordinates) */

		/* Verify gl_PrimitiveID values used in both stages were correct. In TE:
		 *
		 * te_tc_primitive_id = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;
		 * te_primitive_id    = gl_PrimitiveID;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_primitive_id is passed as 3rd string and te_primitive_id is located on
		 * 5th location.
		 */
		const unsigned int n_result_vertices_per_patch_vertex_batch =
			run.n_result_vertices / run.drawcall_count_multiplier / run.n_instances;
		const unsigned int n_result_vertices_per_instance = run.n_result_vertices / run.n_instances;

		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices; ++n_coordinate)
		{
			unsigned int actual_n_coordinate = n_coordinate;

			/* Subsequent instances reset gl_PrimitiveID counter */
			while (actual_n_coordinate >= n_result_vertices_per_instance)
			{
				actual_n_coordinate -= n_result_vertices_per_instance;
			}

			/* Calculate expected gl_PrimitiveID value */
			const int expected_primitive_id = actual_n_coordinate / n_result_vertices_per_patch_vertex_batch;

			/* te_tc_primitive_id */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 2; /* as per comment */

			if (*result_traveller_ptr != expected_primitive_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PrimitiveID value (" << *result_traveller_ptr
								   << ") "
									  "was used in TC stage instead of expected value ("
								   << expected_primitive_id << ") "
															   " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PrimitiveID value used in TC stage");
			}

			/* te_primitive_id */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 4; /* as per comment */

			if (*result_traveller_ptr != expected_primitive_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PrimitiveID value (" << *result_traveller_ptr
								   << ") "
									  "was used in TE stage instead of expected value ("
								   << expected_primitive_id << ") "
															   " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PrimitiveID value used in TE stage");
			}
		} /* for (all result coordinates) */

		/* Verify gl_PatchVerticesIn values used in both stages were correct. In TE:
		 *
		 * te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;
		 * te_patch_vertices_in    = gl_PatchVerticesIn;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_patch_vertices_in takes 2nd location and te_patch_vertices_in is
		 * located at 4th position.
		 *
		 **/
		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices; ++n_coordinate)
		{
			const int expected_patch_vertices_in_value = run.n_patch_vertices;

			/* te_tc_patch_vertices_in */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 1; /* as per comment */

			if (*result_traveller_ptr != expected_patch_vertices_in_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn value ("
								   << *result_traveller_ptr << ") "
															   "was used in TC stage instead of expected value ("
								   << expected_patch_vertices_in_value << ") "
																		  " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PatchVerticesIn value used in TC stage");
			}

			/* te_patch_vertices_in */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 3; /* as per comment */

			if (*result_traveller_ptr != expected_patch_vertices_in_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn value ("
								   << *result_traveller_ptr << ") "
															   "was used in TE stage instead of expected value ("
								   << expected_patch_vertices_in_value << ") "
																		  " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;
			}
		} /* for (all result coordinates) */

		/* Unmap the buffer object - we're done with this iteration */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
	} /* for (all runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}